

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O1

void __thiscall t_go_generator::generate_service_server(t_go_generator *this,t_service *tservice)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int iVar5;
  undefined4 extraout_var;
  long lVar6;
  undefined8 *puVar7;
  long *plVar8;
  undefined4 extraout_var_00;
  ostream *poVar9;
  size_type *psVar10;
  ulong *puVar11;
  pointer pptVar12;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  t_service *tservice_00;
  string escapedFuncName;
  string extends;
  string self;
  string serviceName;
  string pServiceName;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends_processor;
  string extends_processor_new;
  string local_1e0;
  ofstream_with_content_based_conditional_update *local_1c0;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string *local_118;
  string local_110;
  t_service *local_f0;
  vector<t_function_*,_std::allocator<t_function_*>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  char *local_b0;
  long local_a8;
  char local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&local_e8,&tservice->functions_);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"");
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"");
  iVar5 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  local_118 = &(this->super_t_generator).service_name_;
  publicize(&local_158,this,(string *)CONCAT44(extraout_var,iVar5),false,local_118);
  local_f0 = tservice;
  if (tservice->extends_ == (t_service *)0x0) goto LAB_00205c6b;
  type_name_abi_cxx11_(&local_110,this,&tservice->extends_->super_t_type);
  std::__cxx11::string::operator=((string *)&local_198,(string *)&local_110);
  paVar2 = &local_110.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != paVar2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  lVar6 = std::__cxx11::string::rfind((char *)&local_198,0x3a9598,0xffffffffffffffff);
  local_110._M_dataplus._M_p = (pointer)paVar2;
  if (lVar6 == -1) {
    publicize(&local_178,this,&local_198,false,local_118);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_178);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_110.field_2._M_allocated_capacity = *psVar10;
      local_110.field_2._8_8_ = plVar8[3];
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar10;
      local_110._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_110._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != &local_178.field_2) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    std::operator+(&local_110,"New",&local_d0);
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_110);
    _Var14._M_p = local_110._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == paVar2) goto LAB_00205c6b;
  }
  else {
    std::__cxx11::string::substr((ulong)&local_1e0,(ulong)&local_198);
    std::__cxx11::string::substr((ulong)&local_138,(ulong)&local_198);
    publicize(&local_1b8,this,&local_138,false,local_118);
    paVar1 = &local_1e0.field_2;
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar1) {
      uVar13 = local_1e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_1b8._M_string_length + local_1e0._M_string_length) {
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        uVar13 = local_1b8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_1b8._M_string_length + local_1e0._M_string_length)
      goto LAB_0020588f;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_1b8,0,(char *)0x0,(ulong)local_1e0._M_dataplus._M_p);
    }
    else {
LAB_0020588f:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_1b8._M_dataplus._M_p)
      ;
    }
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    psVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_178.field_2._M_allocated_capacity = *psVar10;
      local_178.field_2._8_8_ = puVar7[3];
    }
    else {
      local_178.field_2._M_allocated_capacity = *psVar10;
      local_178._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_178._M_string_length = puVar7[1];
    *puVar7 = psVar10;
    puVar7[1] = 0;
    *(undefined1 *)psVar10 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_178);
    psVar10 = (size_type *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_110.field_2._M_allocated_capacity = *psVar10;
      local_110.field_2._8_8_ = plVar8[3];
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar10;
      local_110._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_110._M_string_length = plVar8[1];
    *plVar8 = (long)psVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    paVar3 = &local_178.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar3) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    paVar4 = &local_138.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar4) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    std::__cxx11::string::substr((ulong)&local_1b8,(ulong)&local_198);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_1b8);
    puVar11 = (ulong *)(plVar8 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_1e0.field_2._M_allocated_capacity = *puVar11;
      local_1e0.field_2._8_8_ = plVar8[3];
      local_1e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1e0.field_2._M_allocated_capacity = *puVar11;
      local_1e0._M_dataplus._M_p = (pointer)*plVar8;
    }
    local_1e0._M_string_length = plVar8[1];
    *plVar8 = (long)puVar11;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_198);
    publicize(&local_138,this,&local_50,false,local_118);
    uVar13 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar1) {
      uVar13 = local_1e0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar13 < local_138._M_string_length + local_1e0._M_string_length) {
      uVar13 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != paVar4) {
        uVar13 = local_138.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar13 < local_138._M_string_length + local_1e0._M_string_length)
      goto LAB_00205b1c;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_138,0,(char *)0x0,(ulong)local_1e0._M_dataplus._M_p);
    }
    else {
LAB_00205b1c:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_1e0,(ulong)local_138._M_dataplus._M_p)
      ;
    }
    psVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_178.field_2._M_allocated_capacity = *psVar10;
      local_178.field_2._8_8_ = puVar7[3];
      local_178._M_dataplus._M_p = (pointer)paVar3;
    }
    else {
      local_178.field_2._M_allocated_capacity = *psVar10;
      local_178._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_178._M_string_length = puVar7[1];
    *puVar7 = psVar10;
    puVar7[1] = 0;
    *(undefined1 *)psVar10 = 0;
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
    psVar10 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar10) {
      local_110.field_2._M_allocated_capacity = *psVar10;
      local_110.field_2._8_8_ = puVar7[3];
      local_110._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar10;
      local_110._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_110._M_string_length = puVar7[1];
    *puVar7 = psVar10;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p != paVar3) {
      operator_delete(local_178._M_dataplus._M_p);
    }
    tservice = local_f0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != paVar4) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    _Var14._M_p = local_1b8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p == &local_1b8.field_2) goto LAB_00205c6b;
  }
  operator_delete(_Var14._M_p);
LAB_00205c6b:
  iVar5 = (*(tservice->super_t_type).super_t_doc._vptr_t_doc[3])(tservice);
  privatize(&local_110,this,(string *)CONCAT44(extraout_var_00,iVar5));
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"self","");
  t_generator::tmp(&local_178,&this->super_t_generator,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_1c0 = &this->f_types_;
  if (local_d0._M_string_length == 0) {
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"type ",5);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_158._M_dataplus._M_p,local_158._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Processor struct {",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"  processorMap map[string]thrift.TProcessorFunction",0x33);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  handler ",10);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_158._M_dataplus._M_p,local_158._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"func (p *",9);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_158._M_dataplus._M_p,local_158._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,
               "Processor) AddToProcessorMap(key string, processor thrift.TProcessorFunction) {",
               0x4f);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"  p.processorMap[key] = processor",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"func (p *",9);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_158._M_dataplus._M_p,local_158._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,
               "Processor) GetProcessorFunction(key string) (processor thrift.TProcessorFunction, ok bool) {"
               ,0x5c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"  processor, ok = p.processorMap[key]",0x25);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  return processor, ok",0x16);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"func (p *",9);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_158._M_dataplus._M_p,local_158._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"Processor) ProcessorMap() map[string]thrift.TProcessorFunction {",0x40);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  return p.processorMap",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"func New",8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_158._M_dataplus._M_p,local_158._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Processor(handler ",0x12);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_158._M_dataplus._M_p,local_158._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,") *",3);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_158._M_dataplus._M_p,local_158._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Processor {",0xb);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  ",2);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_178._M_dataplus._M_p,local_178._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," := &",5);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_158._M_dataplus._M_p,local_158._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,
               "Processor{handler:handler, processorMap:make(map[string]thrift.TProcessorFunction)}"
               ,0x53);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    if (local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pptVar12 = local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      do {
        (*(this->super_t_generator)._vptr_t_generator[3])(&local_1e0,this,&(*pptVar12)->name_);
        t_generator::indent_abi_cxx11_(&local_1b8,&this->super_t_generator);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1c0,local_1b8._M_dataplus._M_p,
                            local_1b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  ",2);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_178._M_dataplus._M_p,local_178._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,".processorMap[\"",0xf);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"] = &",6);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_110._M_dataplus._M_p,local_110._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Processor",9);
        publicize(&local_138,this,&(*pptVar12)->name_,false,local_118);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_138._M_dataplus._M_p,local_138._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"{handler:handler}",0x11);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p);
        }
        pptVar12 = pptVar12 + 1;
      } while (pptVar12 !=
               local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"x","");
    t_generator::tmp(&local_1e0,&this->super_t_generator,&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1b8,&this->super_t_generator);
    tservice_00 = local_f0;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"return ",7);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_178._M_dataplus._M_p,local_178._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    paVar2 = &local_1b8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1b8,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1b8,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"func (p *",9);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_158._M_dataplus._M_p,local_158._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,
               "Processor) Process(ctx context.Context, iprot, oprot thrift.TProtocol) (success bool, err thrift.TException) {"
               ,0x6e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1b8,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"  name, _, seqId, err2 := iprot.ReadMessageBegin(ctx)",0x35);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1b8,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"  if err2 != nil { return false, thrift.WrapTException(err2) }",0x3e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1b8,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"  if processor, ok := p.GetProcessorFunction(name); ok {",0x38);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1b8,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"    return processor.Process(ctx, seqId, iprot, oprot)",0x36);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1b8,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  }",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1b8,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"  iprot.Skip(ctx, thrift.STRUCT)",0x20);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1b8,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  iprot.ReadMessageEnd(ctx)",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1b8,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  ",2);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,
               " := thrift.NewTApplicationException(thrift.UNKNOWN_METHOD, \"Unknown function \" + name)"
               ,0x56);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1b8,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"  oprot.WriteMessageBegin(ctx, name, thrift.EXCEPTION, seqId)",0x3d);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1b8,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  ",2);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,".Write(ctx, oprot)",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1b8,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  oprot.WriteMessageEnd(ctx)",0x1c);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1b8,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  oprot.Flush(ctx)",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1b8,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  return false, ",0x10);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1b8,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"",0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1b8,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1b8._M_dataplus._M_p,local_1b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8._M_dataplus._M_p != paVar2) {
      operator_delete(local_1b8._M_dataplus._M_p);
    }
  }
  else {
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"type ",5);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_158._M_dataplus._M_p,local_158._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Processor struct {",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  *",3);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_d0._M_dataplus._M_p,local_d0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"func New",8);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_158._M_dataplus._M_p,local_158._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Processor(handler ",0x12);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_158._M_dataplus._M_p,local_158._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,") *",3);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_158._M_dataplus._M_p,local_158._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Processor {",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  ",2);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_178._M_dataplus._M_p,local_178._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," := &",5);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_158._M_dataplus._M_p,local_158._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Processor{",10);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_b0,local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(handler)}",10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    if (local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pptVar12 = local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      do {
        (*(this->super_t_generator)._vptr_t_generator[3])(&local_1e0,this,&(*pptVar12)->name_);
        t_generator::indent_abi_cxx11_(&local_1b8,&this->super_t_generator);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1c0,local_1b8._M_dataplus._M_p,
                            local_1b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  ",2);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_178._M_dataplus._M_p,local_178._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,".AddToProcessorMap(\"",0x14);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\", &",4);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_110._M_dataplus._M_p,local_110._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Processor",9);
        publicize(&local_138,this,&(*pptVar12)->name_,false,local_118);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_138._M_dataplus._M_p,local_138._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"{handler:handler})",0x12);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
          operator_delete(local_1b8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
          operator_delete(local_1e0._M_dataplus._M_p);
        }
        pptVar12 = pptVar12 + 1;
      } while (pptVar12 !=
               local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    tservice_00 = local_f0;
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  return ",9);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,local_178._M_dataplus._M_p,local_178._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1c0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"}",1);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  pptVar12 = local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
    pptVar12 = local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
               super__Vector_impl_data._M_start;
  }
  for (; pptVar12 !=
         local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
         super__Vector_impl_data._M_finish; pptVar12 = pptVar12 + 1) {
    generate_process_function(this,tservice_00,*pptVar12);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1c0,::endl_abi_cxx11_._M_dataplus._M_p,
             ::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if (local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_go_generator::generate_service_server(t_service* tservice) {
  // Generate the dispatch methods
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  string extends = "";
  string extends_processor = "";
  string extends_processor_new = "";
  string serviceName(publicize(tservice->get_name()));

  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    size_t index = extends.rfind(".");

    if (index != string::npos) {
      extends_processor = extends.substr(0, index + 1) + publicize(extends.substr(index + 1))
                          + "Processor";
      extends_processor_new = extends.substr(0, index + 1) + "New"
                              + publicize(extends.substr(index + 1)) + "Processor";
    } else {
      extends_processor = publicize(extends) + "Processor";
      extends_processor_new = "New" + extends_processor;
    }
  }

  string pServiceName(privatize(tservice->get_name()));
  // Generate the header portion
  string self(tmp("self"));

  if (extends_processor.empty()) {
    f_types_ << indent() << "type " << serviceName << "Processor struct {" << endl;
    f_types_ << indent() << "  processorMap map[string]thrift.TProcessorFunction" << endl;
    f_types_ << indent() << "  handler " << serviceName << endl;
    f_types_ << indent() << "}" << endl << endl;
    f_types_ << indent() << "func (p *" << serviceName
               << "Processor) AddToProcessorMap(key string, processor thrift.TProcessorFunction) {"
               << endl;
    f_types_ << indent() << "  p.processorMap[key] = processor" << endl;
    f_types_ << indent() << "}" << endl << endl;
    f_types_ << indent() << "func (p *" << serviceName
               << "Processor) GetProcessorFunction(key string) "
                  "(processor thrift.TProcessorFunction, ok bool) {" << endl;
    f_types_ << indent() << "  processor, ok = p.processorMap[key]" << endl;
    f_types_ << indent() << "  return processor, ok" << endl;
    f_types_ << indent() << "}" << endl << endl;
    f_types_ << indent() << "func (p *" << serviceName
               << "Processor) ProcessorMap() map[string]thrift.TProcessorFunction {" << endl;
    f_types_ << indent() << "  return p.processorMap" << endl;
    f_types_ << indent() << "}" << endl << endl;
    f_types_ << indent() << "func New" << serviceName << "Processor(handler " << serviceName
               << ") *" << serviceName << "Processor {" << endl << endl;
    f_types_
        << indent() << "  " << self << " := &" << serviceName
        << "Processor{handler:handler, processorMap:make(map[string]thrift.TProcessorFunction)}"
        << endl;

    for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
      string escapedFuncName(escape_string((*f_iter)->get_name()));
      f_types_ << indent() << "  " << self << ".processorMap[\"" << escapedFuncName << "\"] = &"
                 << pServiceName << "Processor" << publicize((*f_iter)->get_name())
                 << "{handler:handler}" << endl;
    }

    string x(tmp("x"));
    f_types_ << indent() << "return " << self << endl;
    f_types_ << indent() << "}" << endl << endl;
    f_types_ << indent() << "func (p *" << serviceName
               << "Processor) Process(ctx context.Context, iprot, oprot thrift.TProtocol) (success bool, err "
                  "thrift.TException) {" << endl;
    f_types_ << indent() << "  name, _, seqId, err2 := iprot.ReadMessageBegin(ctx)" << endl;
    f_types_ << indent() << "  if err2 != nil { return false, thrift.WrapTException(err2) }" << endl;
    f_types_ << indent() << "  if processor, ok := p.GetProcessorFunction(name); ok {" << endl;
    f_types_ << indent() << "    return processor.Process(ctx, seqId, iprot, oprot)" << endl;
    f_types_ << indent() << "  }" << endl;
    f_types_ << indent() << "  iprot.Skip(ctx, thrift.STRUCT)" << endl;
    f_types_ << indent() << "  iprot.ReadMessageEnd(ctx)" << endl;
    f_types_ << indent() << "  " << x
               << " := thrift.NewTApplicationException(thrift.UNKNOWN_METHOD, \"Unknown function "
                  "\" + name)" << endl;
    f_types_ << indent() << "  oprot.WriteMessageBegin(ctx, name, thrift.EXCEPTION, seqId)" << endl;
    f_types_ << indent() << "  " << x << ".Write(ctx, oprot)" << endl;
    f_types_ << indent() << "  oprot.WriteMessageEnd(ctx)" << endl;
    f_types_ << indent() << "  oprot.Flush(ctx)" << endl;
    f_types_ << indent() << "  return false, " << x << endl;
    f_types_ << indent() << "" << endl;
    f_types_ << indent() << "}" << endl << endl;
  } else {
    f_types_ << indent() << "type " << serviceName << "Processor struct {" << endl;
    f_types_ << indent() << "  *" << extends_processor << endl;
    f_types_ << indent() << "}" << endl << endl;
    f_types_ << indent() << "func New" << serviceName << "Processor(handler " << serviceName
               << ") *" << serviceName << "Processor {" << endl;
    f_types_ << indent() << "  " << self << " := &" << serviceName << "Processor{"
               << extends_processor_new << "(handler)}" << endl;

    for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
      string escapedFuncName(escape_string((*f_iter)->get_name()));
      f_types_ << indent() << "  " << self << ".AddToProcessorMap(\"" << escapedFuncName
                 << "\", &" << pServiceName << "Processor" << publicize((*f_iter)->get_name())
                 << "{handler:handler})" << endl;
    }

    f_types_ << indent() << "  return " << self << endl;
    f_types_ << indent() << "}" << endl << endl;
  }

  // Generate the process subfunctions
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    generate_process_function(tservice, *f_iter);
  }

  f_types_ << endl;
}